

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-bind-error.c
# Opt level: O0

int run_test_tcp_listen_without_bind(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined1 local_108 [8];
  uv_tcp_t server;
  int r;
  
  puVar2 = uv_default_loop();
  server.queued_fds._4_4_ = uv_tcp_init(puVar2,(uv_tcp_t *)local_108);
  if (server.queued_fds._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xd2,"r == 0");
    abort();
  }
  server.queued_fds._4_4_ = uv_listen((uv_stream_t *)local_108,0x80,(uv_connection_cb)0x0);
  if (server.queued_fds._4_4_ != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xd4,"r == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-bind-error.c"
            ,0xd6,"0 == uv_loop_close(uv_default_loop())");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(tcp_listen_without_bind) {
  int r;
  uv_tcp_t server;

  r = uv_tcp_init(uv_default_loop(), &server);
  ASSERT(r == 0);
  r = uv_listen((uv_stream_t*)&server, 128, NULL);
  ASSERT(r == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}